

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenuBar(void)

{
  float fVar1;
  ImGuiWindow *this;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect clip_rect;
  ImRect bar_rect;
  ImGuiWindow *window;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    if ((this->Flags & 0x400U) == 0) {
      window._7_1_ = false;
    }
    else {
      if ((((this->DC).MenuBarAppending ^ 0xffU) & 1) == 0) {
        __assert_fail("!window->DC.MenuBarAppending",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                      ,0x1928,"bool ImGui::BeginMenuBar()");
      }
      BeginGroup();
      PushID("##menubar");
      join_0x00001240_0x00001200_ = ImGuiWindow::MenuBarRect(this);
      fVar5 = clip_rect.Max.x;
      fVar2 = clip_rect.Max.x + this->WindowBorderSize;
      fVar3 = clip_rect.Max.y + this->WindowBorderSize;
      fVar1 = bar_rect.Min.x;
      fVar4 = ImMax<float>(this->WindowRounding,this->WindowBorderSize);
      fVar5 = ImMax<float>(fVar5,fVar1 - fVar4);
      ImRect::ImRect((ImRect *)local_38,(float)(int)(fVar2 + 0.5),(float)(int)(fVar3 + 0.5),
                     (float)(int)(fVar5 + 0.5),(float)(int)(bar_rect.Min.y + 0.5));
      ImRect::ClipWith((ImRect *)local_38,&this->OuterRectClipped);
      PushClipRect((ImVec2 *)local_38,&clip_rect.Min,false);
      ImVec2::ImVec2(&local_40,clip_rect.Max.x + (this->DC).MenuBarOffset.x,
                     clip_rect.Max.y + (this->DC).MenuBarOffset.y);
      (this->DC).CursorMaxPos = local_40;
      (this->DC).CursorPos = (this->DC).CursorMaxPos;
      (this->DC).LayoutType = 0;
      (this->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      (this->DC).MenuBarAppending = true;
      AlignTextToFramePadding();
      window._7_1_ = true;
    }
  }
  else {
    window._7_1_ = false;
  }
  return window._7_1_;
}

Assistant:

bool ImGui::BeginMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;
    if (!(window->Flags & ImGuiWindowFlags_MenuBar))
        return false;

    IM_ASSERT(!window->DC.MenuBarAppending);
    BeginGroup(); // Backup position on layer 0 // FIXME: Misleading to use a group for that backup/restore
    PushID("##menubar");

    // We don't clip with current window clipping rectangle as it is already set to the area below. However we clip with window full rect.
    // We remove 1 worth of rounding to Max.x to that text in long menus and small windows don't tend to display over the lower-right rounded area, which looks particularly glitchy.
    ImRect bar_rect = window->MenuBarRect();
    ImRect clip_rect(IM_ROUND(bar_rect.Min.x + window->WindowBorderSize), IM_ROUND(bar_rect.Min.y + window->WindowBorderSize), IM_ROUND(ImMax(bar_rect.Min.x, bar_rect.Max.x - ImMax(window->WindowRounding, window->WindowBorderSize))), IM_ROUND(bar_rect.Max.y));
    clip_rect.ClipWith(window->OuterRectClipped);
    PushClipRect(clip_rect.Min, clip_rect.Max, false);

    // We overwrite CursorMaxPos because BeginGroup sets it to CursorPos (essentially the .EmitItem hack in EndMenuBar() would need something analoguous here, maybe a BeginGroupEx() with flags).
    window->DC.CursorPos = window->DC.CursorMaxPos = ImVec2(bar_rect.Min.x + window->DC.MenuBarOffset.x, bar_rect.Min.y + window->DC.MenuBarOffset.y);
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;
    window->DC.MenuBarAppending = true;
    AlignTextToFramePadding();
    return true;
}